

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

int * nifti_get_intlist(int nvals,char *str)

{
  char cVar1;
  byte bVar2;
  int *__ptr;
  ushort **ppuVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  int iVar7;
  uint uVar8;
  char *__format;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  size_t __size;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  bool bVar19;
  char *cpt;
  uint local_50 [2];
  uint local_48;
  int local_44;
  long local_40;
  size_t local_38;
  
  if ((str != (char *)0x0 && 0 < nvals) && (cVar1 = *str, cVar1 != '\0')) {
    __ptr = (int *)malloc(8);
    if (__ptr == (int *)0x0) {
      nifti_get_intlist_cold_3();
    }
    else {
      *__ptr = 0;
      bVar19 = (cVar1 + 0xa5U & 0xdf) == 0;
      uVar8 = (uint)bVar19;
      if (1 < g_opts_0) {
        fprintf(_stderr,"-d making int_list (vals = %d) from \'%s\'\n",(ulong)(uint)nvals,str);
      }
      local_38 = strlen(str);
      if ((int)(uint)bVar19 < (int)local_38) {
        local_48 = nvals - 1;
        local_40 = 1 - (long)str;
        iVar18 = 0;
        while( true ) {
          lVar13 = (long)(int)uVar8;
          cVar1 = str[lVar13];
          if (((cVar1 == '\0') || (cVar1 == ']')) || (cVar1 == '}')) break;
          ppuVar3 = __ctype_b_loc();
          lVar4 = 1 - lVar13;
          iVar15 = uVar8 - 2;
          local_44 = uVar8 - 1;
          do {
            iVar9 = local_44;
            lVar14 = lVar13;
            bVar2 = str[lVar14];
            lVar13 = lVar14 + 1;
            lVar4 = lVar4 + -1;
            local_44 = iVar9 + 1;
            iVar15 = iVar15 + 1;
          } while ((*(byte *)((long)*ppuVar3 + (long)(char)bVar2 * 2 + 1) & 0x20) != 0);
          if (bVar2 < 0x5d) {
            iVar16 = 1;
            uVar5 = (ulong)local_48;
            if (bVar2 != 0x24) {
              if (bVar2 != 0) goto LAB_00115bd7;
              break;
            }
          }
          else {
            if ((bVar2 == 0x5d) || (bVar2 == 0x7d)) break;
LAB_00115bd7:
            uVar5 = strtol(str + -lVar4,(char **)local_50,10);
            iVar10 = (int)uVar5;
            if ((iVar10 < 0) || (nvals <= iVar10)) {
              fprintf(_stderr,"** ERROR: list index %d is out of range 0..%d\n",uVar5 & 0xffffffff,
                      (ulong)(nvals - 1));
              goto LAB_00115f6f;
            }
            uVar11 = ((ulong)local_50[0] + local_40) - lVar13;
            iVar16 = (int)uVar11;
            if ((iVar10 == 0) && ((uVar11 & 0xffffffff) == 0)) {
              fprintf(_stderr,"** ERROR: list syntax error \'%s\'\n",str + -lVar4);
              goto LAB_00115f6f;
            }
          }
          iVar7 = (int)lVar14 + iVar16;
          lVar4 = ((long)iVar7 << 0x20) + -0x100000000;
          lVar14 = 0;
          iVar10 = iVar7;
          iVar9 = iVar9 + iVar16;
          do {
            iVar12 = iVar9;
            iVar17 = iVar10;
            lVar4 = lVar4 + 0x100000000;
            bVar2 = str[lVar14 + iVar7];
            lVar14 = lVar14 + 1;
            iVar10 = iVar17 + 1;
            iVar9 = iVar12 + 1;
          } while ((*(byte *)((long)*ppuVar3 + (long)(char)bVar2 * 2 + 1) & 0x20) != 0);
          iVar9 = (int)uVar5;
          if (0x2d < bVar2) {
            if (bVar2 == 0x2e) {
              iVar10 = 2;
              if (str[(lVar4 >> 0x20) + 1] == '.') goto LAB_00115d62;
            }
            else if ((bVar2 == 0x7d) || (bVar2 == 0x5d)) goto LAB_00115cd1;
LAB_0011602f:
            pcVar6 = str + lVar14 + (iVar16 + local_44) + -1;
            __format = "** ERROR: index list syntax is bad: \'%s\'\n";
LAB_001160ac:
            fprintf(_stderr,__format,pcVar6);
            goto LAB_00115f6f;
          }
          if ((bVar2 == 0) || (bVar2 == 0x2c)) {
LAB_00115cd1:
            __ptr = (int *)realloc(__ptr,(long)iVar18 * 4 + 8);
            if (__ptr == (int *)0x0) {
LAB_00115fc6:
              fprintf(_stderr,"** nifti_get_intlist: failed realloc of %d ints\n",
                      (ulong)(iVar18 + 2));
              return (int *)0x0;
            }
            iVar18 = iVar18 + 1;
            *__ptr = iVar18;
            __ptr[iVar18] = iVar9;
            cVar1 = str[lVar14 + (long)(local_44 + iVar16) + -1];
            if (((cVar1 == '\0') || (cVar1 == ']')) || (cVar1 == '}')) break;
            uVar8 = ((int)lVar14 + (int)lVar13 + iVar16) - 1;
          }
          else {
            iVar10 = 1;
            if (bVar2 != 0x2d) goto LAB_0011602f;
LAB_00115d62:
            iVar15 = (int)lVar14 + iVar15 + iVar16 + iVar10;
            iVar16 = 1;
            uVar11 = (ulong)local_48;
            if (str[iVar15] != '$') {
              pcVar6 = str + iVar15;
              uVar11 = strtol(pcVar6,(char **)local_50,10);
              iVar15 = (int)uVar11;
              if ((iVar15 < 0) || (nvals <= iVar15)) {
                fprintf(_stderr,"** ERROR: index %d is out of range 0..%d\n",uVar11 & 0xffffffff,
                        (ulong)(nvals - 1));
                goto LAB_00115f6f;
              }
              iVar16 = local_50[0] - (int)pcVar6;
              if (iVar15 == 0 && iVar16 == 0) {
                __format = "** ERROR: index list syntax error \'%s\'\n";
                goto LAB_001160ac;
              }
            }
            iVar12 = iVar12 + iVar16 + iVar10;
            iVar17 = iVar16 + iVar10 + iVar17;
            pcVar6 = str + iVar17;
            do {
              cVar1 = *pcVar6;
              iVar12 = iVar12 + 1;
              iVar17 = iVar17 + 1;
              pcVar6 = pcVar6 + 1;
            } while ((*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x20) != 0);
            iVar15 = iVar9 - (int)uVar11;
            if (cVar1 == '(') {
              lVar13 = strtol(str + iVar17,(char **)local_50,10);
              iVar9 = (int)lVar13;
              if (iVar9 == 0) {
                nifti_get_intlist_cold_1();
                return (int *)0x0;
              }
              iVar17 = iVar17 + (local_50[0] - (int)(str + iVar17));
              iVar12 = iVar17 + (uint)(str[iVar17] == ')');
              if (0 < iVar15 * iVar9) {
                fprintf(_stderr,"** WARNING: index list \'%d..%d(%d)\' means nothing\n",
                        uVar5 & 0xffffffff,uVar11);
              }
            }
            else {
              iVar9 = (uint)(iVar15 == 0 || iVar9 < (int)uVar11) * 2 + -1;
            }
            iVar15 = iVar15 * iVar9;
            if (iVar15 < 1) {
              __size = (long)iVar18 * 4 + 8;
              do {
                __ptr = (int *)realloc(__ptr,__size);
                if (__ptr == (int *)0x0) goto LAB_00115fc6;
                iVar18 = iVar18 + 1;
                *__ptr = iVar18;
                *(int *)((long)__ptr + (__size - 4)) = (int)uVar5;
                uVar5 = (ulong)(uint)((int)uVar5 + iVar9);
                __size = __size + 4;
                iVar15 = iVar15 + iVar9 * iVar9;
              } while (iVar15 < 1);
            }
            iVar15 = iVar12 + -1;
            pcVar6 = str + iVar12;
            do {
              cVar1 = *pcVar6;
              iVar15 = iVar15 + 1;
              pcVar6 = pcVar6 + 1;
            } while ((*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x20) != 0);
            uVar8 = (uint)(cVar1 == ',') + iVar15;
          }
          if ((int)local_38 <= (int)uVar8) break;
        }
      }
      if (1 < g_opts_0) {
        nifti_get_intlist_cold_2();
      }
      if (*__ptr != 0) {
        return __ptr;
      }
LAB_00115f6f:
      free(__ptr);
    }
  }
  return (int *)0x0;
}

Assistant:

int * nifti_get_intlist( int nvals , const char * str )
{
   int *subv = NULL ;
   int ii , ipos , nout , slen ;
   int ibot,itop,istep , nused ;
   char *cpt ;

   /* Meaningless input? */
   if( nvals < 1 ) return NULL ;

   /* No selection list? */
   if( str == NULL || str[0] == '\0' ) return NULL ;

   /* skip initial '[' or '{' */
   subv = (int *)malloc( sizeof(int) * 2 ) ;
   if( !subv ) {
      fprintf(stderr,"** nifti_get_intlist: failed alloc of 2 ints\n");
      return NULL;
   }
   subv[0] = nout = 0 ;

   ipos = 0 ;
   if( str[ipos] == '[' || str[ipos] == '{' ) ipos++ ;

   if( g_opts.debug > 1 )
      fprintf(stderr,"-d making int_list (vals = %d) from '%s'\n", nvals, str);

   /**- for each sub-selector until end of input... */

   slen = (int)strlen(str) ;
   while( ipos < slen && !ISEND(str[ipos]) ){

     while( isspace((int) str[ipos]) ) ipos++ ;   /* skip blanks */
      if( ISEND(str[ipos]) ) break ;         /* done */

      /**- get starting value */

      if( str[ipos] == '$' ){  /* special case */
         ibot = nvals-1 ; ipos++ ;
      } else {                 /* decode an integer */
         ibot = strtol( str+ipos , &cpt , 10 ) ;
         if( ibot < 0 ){
           fprintf(stderr,"** ERROR: list index %d is out of range 0..%d\n",
                   ibot,nvals-1) ;
           free(subv) ; return NULL ;
         }
         if( ibot >= nvals ){
           fprintf(stderr,"** ERROR: list index %d is out of range 0..%d\n",
                   ibot,nvals-1) ;
           free(subv) ; return NULL ;
         }
         nused = (cpt-(str+ipos)) ;
         if( ibot == 0 && nused == 0 ){
           fprintf(stderr,"** ERROR: list syntax error '%s'\n",str+ipos) ;
           free(subv) ; return NULL ;
         }
         ipos += nused ;
      }

      while( isspace((int) str[ipos]) ) ipos++ ;   /* skip blanks */

      /**- if that's it for this sub-selector, add one value to list */

      if( str[ipos] == ',' || ISEND(str[ipos]) ){
         nout++ ;
         subv = (int *)realloc( (char *)subv , sizeof(int) * (nout+1) ) ;
         if( !subv ) {
            fprintf(stderr,"** nifti_get_intlist: failed realloc of %d ints\n",
                    nout+1);
            return NULL;
         }
         subv[0]    = nout ;
         subv[nout] = ibot ;
         if( ISEND(str[ipos]) ) break ; /* done */
         ipos++ ; continue ;            /* re-start loop at next sub-selector */
      }

      /**- otherwise, must have '..' or '-' as next inputs */

      if( str[ipos] == '-' ){
         ipos++ ;
      } else if( str[ipos] == '.' && str[ipos+1] == '.' ){
         ipos++ ; ipos++ ;
      } else {
         fprintf(stderr,"** ERROR: index list syntax is bad: '%s'\n",
                 str+ipos) ;
         free(subv) ; return NULL ;
      }

      /**- get ending value for loop now */

      if( str[ipos] == '$' ){  /* special case */
         itop = nvals-1 ; ipos++ ;
      } else {                 /* decode an integer */
         itop = strtol( str+ipos , &cpt , 10 ) ;
         if( itop < 0 ){
           fprintf(stderr,"** ERROR: index %d is out of range 0..%d\n",
                   itop,nvals-1) ;
           free(subv) ; return NULL ;
         }
         if( itop >= nvals ){
           fprintf(stderr,"** ERROR: index %d is out of range 0..%d\n",
                   itop,nvals-1) ;
           free(subv) ; return NULL ;
         }
         nused = (cpt-(str+ipos)) ;
         if( itop == 0 && nused == 0 ){
           fprintf(stderr,"** ERROR: index list syntax error '%s'\n",str+ipos) ;
           free(subv) ; return NULL ;
         }
         ipos += nused ;
      }

      /**- set default loop step */

      istep = (ibot <= itop) ? 1 : -1 ;

      while( isspace((int) str[ipos]) ) ipos++ ;            /* skip blanks */

      /**- check if we have a non-default loop step */

      if( str[ipos] == '(' ){  /* decode an integer */
         ipos++ ;
         istep = strtol( str+ipos , &cpt , 10 ) ;
         if( istep == 0 ){
           fprintf(stderr,"** ERROR: index loop step is 0!\n") ;
           free(subv) ; return NULL ;
         }
         nused = (cpt-(str+ipos)) ;
         ipos += nused ;
         if( str[ipos] == ')' ) ipos++ ;
         if( (ibot-itop)*istep > 0 ){
           fprintf(stderr,"** WARNING: index list '%d..%d(%d)' means nothing\n",
                   ibot,itop,istep ) ;
         }
      }

      /**- add values to output */

      for( ii=ibot ; (ii-itop)*istep <= 0 ; ii += istep ){
         nout++ ;
         subv = (int *)realloc( (char *)subv , sizeof(int) * (nout+1) ) ;
         if( !subv ) {
            fprintf(stderr,"** nifti_get_intlist: failed realloc of %d ints\n",
                    nout+1);
            return NULL;
         }
         subv[0]    = nout ;
         subv[nout] = ii ;
      }

      /**- check if we have a comma to skip over */

      while( isspace((int) str[ipos]) ) ipos++ ;            /* skip blanks */
      if( str[ipos] == ',' ) ipos++ ;                       /* skip commas */

   }  /* end of loop through selector string */

   if( g_opts.debug > 1 ) {
      fprintf(stderr,"+d int_list (vals = %d): ", subv[0]);
      for( ii = 1; ii <= subv[0]; ii++ ) fprintf(stderr,"%d ", subv[ii]);
      fputc('\n',stderr);
   }

   if( subv[0] == 0 ){ free(subv); subv = NULL; }
   return subv ;
}